

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

QRect __thiscall QTableWidget::visualItemRect(QTableWidget *this,QTableWidgetItem *item)

{
  char *__s;
  long in_FS_OFFSET;
  QRect QVar1;
  undefined1 local_38 [16];
  QTableWidgetItem *local_28;
  Data *local_20;
  
  local_20 = *(Data **)(in_FS_OFFSET + 0x28);
  if (item == (QTableWidgetItem *)0x0) {
    QVar1 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  }
  else {
    local_28 = (QTableWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    __s = (char *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
    QTableModel::index((QTableModel *)local_38,__s,(int)item);
    QVar1 = (QRect)(**(code **)(*(long *)&(this->super_QTableView).super_QAbstractItemView.
                                          super_QAbstractScrollArea.super_QFrame.super_QWidget +
                               0x1e0))(this,local_38);
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTableWidget::visualItemRect(const QTableWidgetItem *item) const
{
    Q_D(const QTableWidget);
    if (!item)
        return QRect();
    QModelIndex index = d->tableModel()->index(const_cast<QTableWidgetItem*>(item));
    Q_ASSERT(index.isValid());
    return visualRect(index);
}